

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O3

gdImagePtr gdImageCreateFromWBMPCtx(gdIOCtx *infile)

{
  int iVar1;
  int iVar2;
  gdImagePtr im;
  ulong uVar3;
  int color;
  Wbmp *wbmp_00;
  long lVar4;
  int y;
  Wbmp *wbmp;
  Wbmp *local_40;
  ulong local_38;
  
  iVar1 = readwbmp(gd_getin,infile,&local_40);
  if (iVar1 == 0) {
    im = gdImageCreate(local_40->width,local_40->height);
    if (im != (gdImagePtr)0x0) {
      iVar1 = gdImageColorAllocate(im,0xff,0xff,0xff);
      uVar3 = 0;
      iVar2 = gdImageColorAllocate(im,0,0,0);
      wbmp_00 = local_40;
      if (0 < local_40->height) {
        y = 0;
        do {
          if (0 < wbmp_00->width) {
            lVar4 = 0;
            local_38 = uVar3;
            do {
              color = iVar1;
              if (wbmp_00->bitmap[(int)uVar3 + lVar4] != 1) {
                color = iVar2;
              }
              gdImageSetPixel(im,(int)lVar4,y,color);
              lVar4 = lVar4 + 1;
              wbmp_00 = local_40;
            } while ((int)lVar4 < local_40->width);
            uVar3 = (ulong)(uint)((int)local_38 + (int)lVar4);
          }
          y = y + 1;
        } while (y < wbmp_00->height);
      }
      freewbmp(wbmp_00);
      return im;
    }
    freewbmp(local_40);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromWBMPCtx(gdIOCtx *infile)
{
	Wbmp *wbmp;
	gdImagePtr im = NULL;
	int black, white;
	int col, row, pos;

	if(readwbmp(&gd_getin, infile, &wbmp)) {
		return (NULL);
	}

	if(!(im = gdImageCreate(wbmp->width, wbmp->height))) {
		freewbmp(wbmp);
		return NULL;
	}

	/* create the background color */
	white = gdImageColorAllocate(im, 255, 255, 255);
	/* create foreground color */
	black = gdImageColorAllocate(im, 0, 0, 0);

	/* fill in image (in a wbmp 1 = white/ 0 = black) */
	pos = 0;
	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width; col++) {
			if(wbmp->bitmap[pos++] == WBMP_WHITE) {
				gdImageSetPixel(im, col, row, white);
			} else {
				gdImageSetPixel(im, col, row, black);
			}
		}
	}

	freewbmp(wbmp);

	return im;
}